

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void chatra::initializeStTables(void)

{
  size_t *psVar1;
  size_t sVar2;
  pair<chatra::NodeType,_chatra::StatementAttributes> *p;
  undefined1 auVar3 [8];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_type __new_size;
  initializer_list<chatra::StatementPatternElement> __l;
  initializer_list<chatra::StatementPatternElement> __l_00;
  initializer_list<chatra::StatementPatternElement> __l_01;
  initializer_list<chatra::StatementPatternElement> __l_02;
  initializer_list<chatra::StatementPatternElement> __l_03;
  initializer_list<chatra::StatementPatternElement> __l_04;
  initializer_list<chatra::StatementPatternElement> __l_05;
  initializer_list<chatra::StatementPatternElement> __l_06;
  initializer_list<chatra::StatementPatternElement> __l_07;
  initializer_list<chatra::StatementPatternElement> __l_08;
  initializer_list<chatra::StatementPatternElement> __l_09;
  initializer_list<chatra::StatementPatternElement> __l_10;
  initializer_list<chatra::StatementPatternElement> __l_11;
  initializer_list<chatra::StatementPatternElement> __l_12;
  initializer_list<chatra::StatementPatternElement> __l_13;
  initializer_list<chatra::StatementPatternElement> __l_14;
  initializer_list<chatra::StatementPatternElement> __l_15;
  initializer_list<chatra::StatementPatternElement> __l_16;
  initializer_list<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> __l_17;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_1910;
  undefined1 local_18e0 [8];
  undefined8 local_18d8;
  undefined8 local_18d0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_18c8;
  undefined1 local_18b0 [8];
  undefined8 local_18a8;
  undefined8 local_18a0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1898;
  undefined1 local_1880 [8];
  undefined8 local_1878;
  undefined8 local_1870;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1868;
  undefined1 local_1850 [8];
  undefined8 local_1848;
  undefined8 local_1840;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1838;
  undefined1 local_1820;
  undefined8 local_1818;
  undefined8 local_1810;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1808;
  undefined1 local_17f0 [8];
  undefined8 local_17e8;
  undefined8 local_17e0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_17d8;
  undefined1 local_17c0 [8];
  undefined8 local_17b8;
  undefined8 local_17b0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_17a8;
  undefined1 local_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1778;
  undefined1 local_1760 [8];
  undefined8 local_1758;
  undefined8 local_1750;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1748;
  undefined1 local_1730 [8];
  undefined8 local_1728;
  undefined8 local_1720;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1718;
  undefined1 local_1700;
  undefined8 local_16f8;
  undefined8 local_16f0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_16e8;
  undefined1 local_16d0 [8];
  undefined8 local_16c8;
  undefined8 local_16c0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_16b8;
  undefined1 local_16a0 [8];
  undefined8 local_1698;
  undefined8 local_1690;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1688;
  undefined1 local_1670 [8];
  undefined8 local_1668;
  undefined8 local_1660;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1658;
  undefined1 local_1640 [8];
  undefined8 local_1638;
  undefined8 local_1630;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1628;
  undefined1 local_1610;
  undefined8 local_1608;
  undefined8 local_1600;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_15f8;
  undefined1 local_15e0;
  undefined8 local_15d8;
  undefined8 local_15d0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_15c8;
  undefined1 local_15b0 [8];
  undefined8 local_15a8;
  undefined8 local_15a0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1598;
  undefined1 local_1580;
  undefined8 local_1578;
  undefined8 local_1570;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1568;
  undefined1 local_1550 [8];
  undefined8 local_1548;
  undefined8 local_1540;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1538;
  undefined1 local_1520 [8];
  undefined8 local_1518;
  undefined8 local_1510;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1508;
  undefined1 local_14f0 [8];
  undefined8 local_14e8;
  undefined8 local_14e0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_14d8;
  undefined1 local_14c0;
  undefined8 local_14b8;
  undefined8 local_14b0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_14a8;
  undefined8 local_1490;
  undefined8 local_1488;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1480;
  undefined8 local_1468;
  undefined8 local_1460;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1458;
  undefined8 local_1440;
  undefined8 local_1438;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1430;
  undefined8 local_1418;
  undefined8 local_1410;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1408;
  undefined8 local_13f0;
  undefined8 local_13e8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_13e0;
  undefined8 local_13c8;
  undefined8 local_13c0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_13b8;
  undefined8 local_13a0;
  undefined8 local_1398;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1390;
  undefined8 local_1378;
  undefined8 local_1370;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1368;
  undefined8 local_1350;
  undefined8 local_1348;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1340;
  undefined8 local_1328;
  undefined8 local_1320;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1318;
  undefined8 local_1300;
  undefined8 local_12f8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_12f0;
  undefined8 local_12d8;
  undefined8 local_12d0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_12c8;
  undefined8 local_12b0;
  undefined8 local_12a8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_12a0;
  undefined8 local_1288;
  undefined8 local_1280;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1278;
  undefined8 local_1260;
  undefined8 local_1258;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1250;
  undefined8 local_1238;
  undefined8 local_1230;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1228;
  undefined8 local_1210;
  undefined8 local_1208;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1200;
  undefined8 local_11e8;
  undefined8 local_11e0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_11d8;
  undefined8 local_11c0;
  undefined8 local_11b8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_11b0;
  undefined8 local_1198;
  undefined8 local_1190;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1188;
  undefined8 local_1170;
  undefined8 local_1168;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1160;
  undefined8 local_1148;
  undefined8 local_1140;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1138;
  undefined8 local_1120;
  undefined8 local_1118;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1110;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_10e8;
  StatementPatternElement local_10d0;
  undefined8 local_1098;
  undefined1 local_1090;
  undefined8 local_1088;
  uint *local_1080;
  undefined8 local_1078;
  uint local_1070 [2];
  undefined4 uStack_1068;
  undefined4 uStack_1064;
  undefined8 local_1060;
  undefined1 local_1058;
  undefined8 local_1050;
  uint *local_1048;
  undefined8 local_1040;
  uint local_1038 [2];
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined8 local_1028;
  undefined1 local_1020;
  undefined8 local_1018;
  uint *local_1010;
  undefined8 local_1008;
  uint local_1000 [2];
  undefined4 uStack_ff8;
  undefined4 uStack_ff4;
  undefined8 local_ff0;
  undefined1 local_fe8;
  undefined8 local_fe0;
  uint *local_fd8;
  undefined8 local_fd0;
  uint local_fc8 [2];
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined8 local_fb8;
  undefined1 local_fb0;
  undefined8 local_fa8;
  uint *local_fa0;
  undefined8 local_f98;
  uint local_f90 [2];
  undefined4 uStack_f88;
  undefined4 uStack_f84;
  undefined8 local_f80;
  undefined1 local_f78;
  undefined8 local_f70;
  uint *local_f68;
  undefined8 local_f60;
  uint local_f58 [2];
  undefined4 uStack_f50;
  undefined4 uStack_f4c;
  undefined8 local_f48;
  undefined1 local_f40;
  undefined8 local_f38;
  undefined1 *local_f30 [2];
  undefined1 local_f20 [8];
  undefined8 uStack_f18;
  StatementPatternElement local_f10;
  undefined8 local_ed8;
  undefined1 local_ed0;
  undefined8 local_ec8;
  uint *local_ec0;
  undefined8 local_eb8;
  uint local_eb0 [2];
  undefined4 uStack_ea8;
  undefined4 uStack_ea4;
  undefined8 local_ea0;
  undefined1 local_e98;
  undefined8 local_e90;
  uint *local_e88;
  undefined8 local_e80;
  uint local_e78 [2];
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined8 local_e68;
  undefined1 local_e60;
  undefined8 local_e58;
  uint *local_e50;
  undefined8 local_e48;
  uint local_e40 [2];
  undefined4 uStack_e38;
  undefined4 uStack_e34;
  undefined8 local_e30;
  undefined1 local_e28;
  undefined8 local_e20;
  uint *local_e18;
  undefined8 local_e10;
  uint local_e08 [2];
  undefined4 uStack_e00;
  undefined4 uStack_dfc;
  undefined1 *local_df8;
  undefined1 local_df0;
  undefined8 local_de8;
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [8];
  undefined8 uStack_dc8;
  StatementPatternElement local_dc0;
  undefined8 local_d88;
  undefined1 local_d80;
  undefined8 local_d78;
  uint *local_d70;
  undefined8 local_d68;
  uint local_d60 [2];
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined8 local_d50;
  undefined1 local_d48;
  undefined8 local_d40;
  uint *local_d38;
  undefined8 local_d30;
  uint local_d28 [2];
  undefined4 uStack_d20;
  undefined4 uStack_d1c;
  undefined8 local_d18;
  undefined1 local_d10;
  undefined8 local_d08;
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [8];
  undefined8 uStack_ce8;
  StatementPatternElement local_ce0;
  undefined8 local_ca8;
  undefined1 local_ca0;
  undefined8 local_c98;
  uint *local_c90;
  undefined8 local_c88;
  uint local_c80 [2];
  undefined4 uStack_c78;
  undefined4 uStack_c74;
  undefined8 local_c70;
  undefined1 local_c68;
  undefined8 local_c60;
  undefined1 *local_c58 [2];
  undefined1 local_c48 [8];
  undefined8 uStack_c40;
  StatementPatternElement local_c38;
  undefined8 local_c00;
  undefined1 local_bf8;
  undefined8 local_bf0;
  uint *local_be8;
  undefined8 local_be0;
  uint local_bd8 [2];
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined1 *local_bc8;
  undefined1 local_bc0;
  undefined8 local_bb8;
  undefined1 *local_bb0 [2];
  undefined1 local_ba0 [8];
  undefined8 uStack_b98;
  StatementPatternElement local_b90;
  undefined8 local_b58;
  undefined1 local_b50;
  undefined8 local_b48;
  undefined1 *local_b40 [2];
  undefined1 local_b30 [8];
  undefined8 uStack_b28;
  StatementPatternElement local_b20;
  undefined8 local_ae8;
  undefined1 local_ae0;
  undefined8 local_ad8;
  undefined1 *local_ad0 [2];
  undefined1 local_ac0 [8];
  undefined8 uStack_ab8;
  StatementPatternElement local_ab0;
  undefined1 *local_a78;
  bool local_a70;
  size_t local_a68;
  _Alloc_hider local_a60;
  size_type local_a58;
  char local_a50 [16];
  undefined1 *local_a40;
  bool local_a38;
  size_t local_a30;
  _Alloc_hider local_a28;
  size_type local_a20;
  char local_a18 [16];
  undefined1 *local_a08;
  bool local_a00;
  size_t local_9f8;
  _Alloc_hider local_9f0;
  size_type local_9e8;
  char local_9e0 [16];
  undefined1 *local_9d0;
  bool local_9c8;
  size_t local_9c0;
  _Alloc_hider local_9b8;
  size_type local_9b0;
  char local_9a8 [16];
  undefined1 *local_998;
  bool local_990;
  size_t local_988;
  _Alloc_hider local_980;
  size_type local_978;
  char local_970 [16];
  undefined1 *local_960;
  bool local_958;
  size_t local_950;
  _Alloc_hider local_948;
  size_type local_940;
  char local_938 [16];
  StatementPatternElement local_928;
  StatementPatternElement local_8f0;
  StatementPatternElement local_8b8;
  undefined1 *local_880;
  bool local_878;
  size_t local_870;
  _Alloc_hider local_868;
  size_type local_860;
  char local_858 [16];
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_848;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_828;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_808;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_7e8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_7c8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_7a8;
  undefined1 local_790 [8];
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  sourceForStAttrs;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_758;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_738;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_718;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_6f8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_6d8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_6b8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_698;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_678;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_658;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_638;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_618;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_5f8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_5d8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_5b8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_598;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_578;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  undefined1 *local_520;
  undefined8 local_518;
  undefined1 local_510 [8];
  undefined8 uStack_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  uint *local_4e0;
  undefined8 local_4d8;
  uint local_4d0 [2];
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  uint *local_4c0;
  undefined8 local_4b8;
  uint local_4b0 [2];
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  uint *local_4a0;
  undefined8 local_498;
  uint local_490 [2];
  undefined4 uStack_488;
  undefined4 uStack_484;
  uint *local_480;
  undefined8 local_478;
  uint local_470 [2];
  undefined4 uStack_468;
  undefined4 uStack_464;
  uint *local_460;
  undefined8 local_458;
  uint local_450 [2];
  undefined4 uStack_448;
  undefined4 uStack_444;
  uint *local_440;
  undefined8 local_438;
  uint local_430 [2];
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 *local_420;
  undefined8 local_418;
  undefined1 local_410 [8];
  undefined8 uStack_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  uint *local_3c0;
  undefined8 local_3b8;
  uint local_3b0 [2];
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  uint *local_3a0;
  undefined8 local_398;
  uint local_390 [2];
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [8];
  undefined8 uStack_368;
  char *local_360;
  size_type local_358;
  char local_350 [8];
  undefined8 uStack_348;
  char *local_340;
  size_type local_338;
  char local_330 [8];
  undefined8 uStack_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  uint *local_300;
  undefined8 local_2f8;
  uint local_2f0 [2];
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [8];
  undefined8 uStack_2c8;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0 [8];
  undefined8 uStack_2a8;
  char *local_2a0;
  size_type local_298;
  char local_290 [8];
  undefined8 uStack_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  uint *local_260;
  undefined8 local_258;
  uint local_250 [2];
  undefined4 uStack_248;
  undefined4 uStack_244;
  uint *local_240;
  undefined8 local_238;
  uint local_230 [2];
  undefined4 uStack_228;
  undefined4 uStack_224;
  uint *local_220;
  undefined8 local_218;
  uint local_210 [2];
  undefined4 uStack_208;
  undefined4 uStack_204;
  uint *local_200;
  undefined8 local_1f8;
  uint local_1f0 [2];
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [8];
  undefined8 uStack_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  uint *local_1a0;
  undefined8 local_198;
  uint local_190 [2];
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170 [8];
  undefined8 uStack_168;
  char *local_160;
  size_type local_158;
  char local_150 [8];
  undefined8 uStack_148;
  char *local_140;
  size_type local_138;
  char local_130 [8];
  undefined8 uStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [8];
  undefined8 uStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  size_type local_78;
  char local_70 [8];
  undefined8 uStack_68;
  allocator_type local_5b;
  allocator_type local_5a;
  allocator_type local_59;
  allocator_type local_58;
  allocator_type local_57;
  allocator_type local_56;
  allocator_type local_55;
  allocator_type local_54;
  allocator_type local_53;
  allocator_type local_52;
  allocator_type local_51;
  allocator_type local_50;
  allocator_type local_4f;
  allocator_type local_4e;
  allocator_type local_4d;
  allocator_type local_4c;
  allocator_type local_4b;
  allocator_type local_4a;
  allocator_type local_49;
  undefined1 *local_48;
  
  local_540 = &local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"");
  local_b20.errorMessage._M_dataplus._M_p = (pointer)&local_b20.errorMessage.field_2;
  local_b20.type = LabelWithColon;
  local_b20.token = Invalid;
  local_b20.required = false;
  local_b20.subNodeIndex = 0;
  if (local_540 == &local_530) {
    local_b20.errorMessage.field_2._8_4_ = local_530._8_4_;
    local_b20.errorMessage.field_2._12_4_ = local_530._12_4_;
  }
  else {
    local_b20.errorMessage._M_dataplus._M_p = (pointer)local_540;
  }
  local_b20.errorMessage._M_string_length = local_538;
  local_538 = 0;
  local_530._M_allocated_capacity._0_4_ = local_530._M_allocated_capacity._0_4_ & 0xffffff00;
  local_540 = &local_530;
  local_520 = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"expected package name","");
  local_ad0[0] = local_ac0;
  local_ae8 = 0xffffffff00000001;
  local_ae0 = 1;
  local_ad8 = 1;
  if (local_520 == local_510) {
    uStack_ab8 = uStack_508;
  }
  else {
    local_ad0[0] = local_520;
  }
  local_ad0[1] = (undefined1 *)local_518;
  local_518 = 0;
  local_510[0] = 0;
  __l._M_len = 2;
  __l._M_array = &local_b20;
  local_520 = local_510;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
          *)&sourceForStAttrs.
             super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,&local_5b);
  local_1490 = 2;
  local_1488 = 1;
  local_1480.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)sourceForStAttrs.
                super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sourceForStAttrs.
  super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1910.first = Import;
  local_1910.second.subNodes = 2;
  local_1910.second.skipTokens = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1910.second.pattern,&local_1480);
  local_48 = local_18e0;
  local_500 = &local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
  local_10d0.errorMessage._M_dataplus._M_p = (pointer)&local_10d0.errorMessage.field_2;
  local_10d0.type = StorageClassSpecifier;
  local_10d0.token = Invalid;
  local_10d0.required = false;
  local_10d0.subNodeIndex = 0;
  if (local_500 == &local_4f0) {
    local_10d0.errorMessage.field_2._8_4_ = local_4f0._8_4_;
    local_10d0.errorMessage.field_2._12_4_ = local_4f0._12_4_;
  }
  else {
    local_10d0.errorMessage._M_dataplus._M_p = (pointer)local_500;
  }
  local_10d0.errorMessage._M_string_length = local_4f8;
  local_4f8 = 0;
  local_4f0._M_allocated_capacity._0_4_ = local_4f0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_500 = &local_4f0;
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"");
  local_1080 = local_1070;
  local_1098 = 0xffffffff00000001;
  local_1090 = 0;
  local_1088 = 1;
  if (local_4e0 == local_4d0) {
    uStack_1068 = uStack_4c8;
    uStack_1064 = uStack_4c4;
  }
  else {
    local_1080 = local_4e0;
  }
  local_1078 = local_4d8;
  local_4d8 = 0;
  local_4d0[0] = local_4d0[0] & 0xffffff00;
  local_4e0 = local_4d0;
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
  local_1048 = local_1038;
  local_1060 = 0xffffffff00000002;
  local_1058 = 0;
  local_1050 = 2;
  if (local_4c0 == local_4b0) {
    uStack_1030 = uStack_4a8;
    uStack_102c = uStack_4a4;
  }
  else {
    local_1048 = local_4c0;
  }
  local_1040 = local_4b8;
  local_4b8 = 0;
  local_4b0[0] = local_4b0[0] & 0xffffff00;
  local_4c0 = local_4b0;
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"expected parameter list","")
  ;
  local_1010 = local_1000;
  local_1028 = 0xffffffff00000008;
  local_1020 = 1;
  local_1018 = 3;
  if (local_4a0 == local_490) {
    uStack_ff8 = uStack_488;
    uStack_ff4 = uStack_484;
  }
  else {
    local_1010 = local_4a0;
  }
  local_1008 = local_498;
  local_498 = 0;
  local_490[0] = local_490[0] & 0xffffff00;
  local_4a0 = local_490;
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"");
  local_fd8 = local_fc8;
  local_ff0 = 0xffffffff00000002;
  local_fe8 = 0;
  local_fe0 = 4;
  if (local_480 == local_470) {
    uStack_fc0 = uStack_468;
    uStack_fbc = uStack_464;
  }
  else {
    local_fd8 = local_480;
  }
  local_fd0 = local_478;
  local_478 = 0;
  local_470[0] = local_470[0] & 0xffffff00;
  local_480 = local_470;
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
  local_fa0 = local_f90;
  local_fb8 = 0xffffffff00000008;
  local_fb0 = 0;
  local_fa8 = 5;
  if (local_460 == local_450) {
    uStack_f88 = uStack_448;
    uStack_f84 = uStack_444;
  }
  else {
    local_fa0 = local_460;
  }
  local_f98 = local_458;
  local_458 = 0;
  local_450[0] = local_450[0] & 0xffffff00;
  local_460 = local_450;
  local_440 = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"");
  local_f68 = local_f58;
  local_f80 = 0xa00000000;
  local_f78 = 0;
  local_f70 = 6;
  if (local_440 == local_430) {
    uStack_f50 = uStack_428;
    uStack_f4c = uStack_424;
  }
  else {
    local_f68 = local_440;
  }
  local_f60 = local_438;
  local_438 = 0;
  local_430[0] = local_430[0] & 0xffffff00;
  local_440 = local_430;
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"");
  local_f30[0] = local_f20;
  local_f48 = 0xffffffff00000009;
  local_f40 = 0;
  local_f38 = 7;
  if (local_420 == local_410) {
    uStack_f18 = uStack_408;
  }
  else {
    local_f30[0] = local_420;
  }
  local_f30[1] = (undefined1 *)local_418;
  local_418 = 0;
  local_410[0] = 0;
  __l_00._M_len = 8;
  __l_00._M_array = &local_10d0;
  local_420 = local_410;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_758,__l_00,&local_5a);
  local_1468 = 8;
  local_1460 = 1;
  local_1458.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_758.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1458.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_758.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1458.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_758.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_758.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_758.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_758.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18e0[0] = 3;
  local_18d8 = 8;
  local_18d0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_18c8,&local_1458);
  local_48 = local_18b0;
  local_400 = &local_3f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_400,"expected operator parameter set","");
  local_ab0.errorMessage._M_dataplus._M_p = (pointer)&local_ab0.errorMessage.field_2;
  local_ab0.type = OperatorParameter;
  local_ab0.token = Invalid;
  local_ab0.required = true;
  local_ab0.subNodeIndex = 0;
  if (local_400 == &local_3f0) {
    local_ab0.errorMessage.field_2._8_8_ = local_3f0._8_8_;
  }
  else {
    local_ab0.errorMessage._M_dataplus._M_p = (pointer)local_400;
  }
  local_ab0.errorMessage._M_string_length = local_3f8;
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  __l_01._M_len = 1;
  __l_01._M_array = &local_ab0;
  local_400 = &local_3f0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_738,__l_01,&local_59);
  local_1440 = 1;
  local_1438 = 2;
  local_1430.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_738.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1430.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_738.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1430.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_738.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_738.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_738.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_738.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18b0[0] = 4;
  local_18a8 = 1;
  local_18a0 = 2;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1898,&local_1430);
  local_48 = local_1880;
  local_3e0 = &local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"");
  local_dc0.errorMessage._M_dataplus._M_p = (pointer)&local_dc0.errorMessage.field_2;
  local_dc0.type = StorageClassSpecifier;
  local_dc0.token = Invalid;
  local_dc0.required = false;
  local_dc0.subNodeIndex = 0;
  if (local_3e0 == &local_3d0) {
    local_dc0.errorMessage.field_2._8_4_ = local_3d0._8_4_;
    local_dc0.errorMessage.field_2._12_4_ = local_3d0._12_4_;
  }
  else {
    local_dc0.errorMessage._M_dataplus._M_p = (pointer)local_3e0;
  }
  local_dc0.errorMessage._M_string_length = local_3d8;
  local_3d8 = 0;
  local_3d0._M_allocated_capacity._0_4_ = local_3d0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_3e0 = &local_3d0;
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"expected class name","");
  local_d70 = local_d60;
  local_d88 = 0xffffffff00000001;
  local_d80 = 1;
  local_d78 = 1;
  if (local_3c0 == local_3b0) {
    uStack_d58 = uStack_3a8;
    uStack_d54 = uStack_3a4;
  }
  else {
    local_d70 = local_3c0;
  }
  local_d68 = local_3b8;
  local_3b8 = 0;
  local_3b0[0] = local_3b0[0] & 0xffffff00;
  local_3c0 = local_3b0;
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
  local_d38 = local_d28;
  local_d50 = 0xe00000000;
  local_d48 = 0;
  local_d40 = 2;
  if (local_3a0 == local_390) {
    uStack_d20 = uStack_388;
    uStack_d1c = uStack_384;
  }
  else {
    local_d38 = local_3a0;
  }
  local_d30 = local_398;
  local_398 = 0;
  local_390[0] = local_390[0] & 0xffffff00;
  local_3a0 = local_390;
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
  local_d00[0] = local_cf0;
  local_d18 = 0xffffffff0000000a;
  local_d10 = 0;
  local_d08 = 3;
  if (local_380 == local_370) {
    uStack_ce8 = uStack_368;
  }
  else {
    local_d00[0] = local_380;
  }
  local_d00[1] = (undefined1 *)local_378;
  local_378 = 0;
  local_370[0] = 0;
  __l_02._M_len = 4;
  __l_02._M_array = &local_dc0;
  local_380 = local_370;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_718,__l_02,&local_58);
  local_1418 = 4;
  local_1410 = 1;
  local_1408.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_718.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1408.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_718.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1408.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_718.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_718.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1880[0] = 5;
  local_1878 = 4;
  local_1870 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1868,&local_1408);
  local_48 = local_1850;
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"expected expression","");
  local_a60._M_p = local_a50;
  local_a78 = &DAT_ffffffff00000006;
  local_a70 = true;
  local_a68 = 0;
  if (local_360 == local_350) {
    local_a50[8] = (undefined1)uStack_348;
    local_a50[9] = uStack_348._1_1_;
    local_a50[10] = uStack_348._2_1_;
    local_a50[0xb] = uStack_348._3_1_;
    local_a50[0xc] = uStack_348._4_1_;
    local_a50[0xd] = uStack_348._5_1_;
    local_a50[0xe] = uStack_348._6_1_;
    local_a50[0xf] = uStack_348._7_1_;
  }
  else {
    local_a60._M_p = local_360;
  }
  local_a58 = local_358;
  local_358 = 0;
  local_350[0] = '\0';
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_a78;
  local_360 = local_350;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_6f8,__l_03,&local_57);
  local_13f0 = 1;
  local_13e8 = 0;
  local_13e0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_13e0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_13e0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1850[0] = 6;
  local_1848 = 1;
  local_1840 = 0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1838,&local_13e0);
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13c8 = 0;
  local_13c0 = 1;
  local_13b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1820 = 7;
  local_1818 = 0;
  local_1810 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1808,&local_13b8);
  local_48 = local_17f0;
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"expected expression","");
  local_a28._M_p = local_a18;
  local_a40 = &DAT_ffffffff00000006;
  local_a38 = true;
  local_a30 = 0;
  if (local_340 == local_330) {
    local_a18[8] = (undefined1)uStack_328;
    local_a18[9] = uStack_328._1_1_;
    local_a18[10] = uStack_328._2_1_;
    local_a18[0xb] = uStack_328._3_1_;
    local_a18[0xc] = uStack_328._4_1_;
    local_a18[0xd] = uStack_328._5_1_;
    local_a18[0xe] = uStack_328._6_1_;
    local_a18[0xf] = uStack_328._7_1_;
  }
  else {
    local_a28._M_p = local_340;
  }
  local_a20 = local_338;
  local_338 = 0;
  local_330[0] = '\0';
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_a40;
  local_340 = local_330;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_6d8,__l_04,&local_56);
  local_13a0 = 1;
  local_1398 = 1;
  local_1390.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1390.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1390.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17f0[0] = 8;
  local_17e8 = 1;
  local_17e0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_17d8,&local_1390);
  local_48 = local_17c0;
  local_320 = &local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
  local_ce0.errorMessage._M_dataplus._M_p = (pointer)&local_ce0.errorMessage.field_2;
  local_ce0.type = StorageClassSpecifier;
  local_ce0.token = Invalid;
  local_ce0.required = false;
  local_ce0.subNodeIndex = 0;
  if (local_320 == &local_310) {
    local_ce0.errorMessage.field_2._8_4_ = local_310._8_4_;
    local_ce0.errorMessage.field_2._12_4_ = local_310._12_4_;
  }
  else {
    local_ce0.errorMessage._M_dataplus._M_p = (pointer)local_320;
  }
  local_ce0.errorMessage._M_string_length = local_318;
  local_318 = 0;
  local_310._M_allocated_capacity._0_4_ = local_310._M_allocated_capacity._0_4_ & 0xffffff00;
  local_320 = &local_310;
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,"expected variable definitions","");
  local_c90 = local_c80;
  local_ca8 = 0xffffffff0000000b;
  local_ca0 = 1;
  local_c98 = 1;
  if (local_300 == local_2f0) {
    uStack_c78 = uStack_2e8;
    uStack_c74 = uStack_2e4;
  }
  else {
    local_c90 = local_300;
  }
  local_c88 = local_2f8;
  local_2f8 = 0;
  local_2f0[0] = local_2f0[0] & 0xffffff00;
  local_300 = local_2f0;
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
  local_c58[0] = local_c48;
  local_c70 = 0xffffffff00000009;
  local_c68 = 0;
  local_c60 = 2;
  if (local_2e0 == local_2d0) {
    uStack_c40 = uStack_2c8;
  }
  else {
    local_c58[0] = local_2e0;
  }
  local_c58[1] = (undefined1 *)local_2d8;
  local_2d8 = 0;
  local_2d0[0] = 0;
  __l_05._M_len = 3;
  __l_05._M_array = &local_ce0;
  local_2e0 = local_2d0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_6b8,__l_05,&local_55);
  local_1378 = 3;
  local_1370 = 1;
  local_1368.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1368.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1368.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17c0[0] = 9;
  local_17b8 = 3;
  local_17b0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_17a8,&local_1368);
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10f8 = 0;
  uStack_10f0 = 0;
  local_10e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_10e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1790 = 10;
  local_1788 = 0;
  uStack_1780 = 0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1778,&local_10e8);
  local_48 = local_1760;
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"expected expression","");
  local_9f0._M_p = local_9e0;
  local_a08 = &DAT_ffffffff00000006;
  local_a00 = true;
  local_9f8 = 0;
  if (local_2c0 == local_2b0) {
    local_9e0[8] = (undefined1)uStack_2a8;
    local_9e0[9] = uStack_2a8._1_1_;
    local_9e0[10] = uStack_2a8._2_1_;
    local_9e0[0xb] = uStack_2a8._3_1_;
    local_9e0[0xc] = uStack_2a8._4_1_;
    local_9e0[0xd] = uStack_2a8._5_1_;
    local_9e0[0xe] = uStack_2a8._6_1_;
    local_9e0[0xf] = uStack_2a8._7_1_;
  }
  else {
    local_9f0._M_p = local_2c0;
  }
  local_9e8 = local_2b8;
  local_2b8 = 0;
  local_2b0[0] = '\0';
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_a08;
  local_2c0 = local_2b0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_698,__l_06,&local_54);
  local_1350 = 1;
  local_1348 = 1;
  local_1340.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_698.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1340.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_698.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1340.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_698.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_698.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_698.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_698.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1760[0] = 0xb;
  local_1758 = 1;
  local_1750 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1748,&local_1340);
  local_48 = local_1730;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"expected expression","");
  local_9b8._M_p = local_9a8;
  local_9d0 = &DAT_ffffffff00000006;
  local_9c8 = true;
  local_9c0 = 0;
  if (local_2a0 == local_290) {
    local_9a8[8] = (undefined1)uStack_288;
    local_9a8[9] = uStack_288._1_1_;
    local_9a8[10] = uStack_288._2_1_;
    local_9a8[0xb] = uStack_288._3_1_;
    local_9a8[0xc] = uStack_288._4_1_;
    local_9a8[0xd] = uStack_288._5_1_;
    local_9a8[0xe] = uStack_288._6_1_;
    local_9a8[0xf] = uStack_288._7_1_;
  }
  else {
    local_9b8._M_p = local_2a0;
  }
  local_9b0 = local_298;
  local_298 = 0;
  local_290[0] = '\0';
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_9d0;
  local_2a0 = local_290;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_678,__l_07,&local_53);
  local_1328 = 1;
  local_1320 = 2;
  local_1318.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_678.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1318.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_678.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1318.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_678.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_678.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1730[0] = 0xc;
  local_1728 = 1;
  local_1720 = 2;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1718,&local_1318);
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1300 = 0;
  local_12f8 = 1;
  local_12f0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12f0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12f0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1700 = 0xd;
  local_16f8 = 0;
  local_16f0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_16e8,&local_12f0);
  local_48 = local_16d0;
  local_280 = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"");
  local_f10.errorMessage._M_dataplus._M_p = (pointer)&local_f10.errorMessage.field_2;
  local_f10.type = LabelWithColon;
  local_f10.token = Invalid;
  local_f10.required = false;
  local_f10.subNodeIndex = 1;
  if (local_280 == &local_270) {
    local_f10.errorMessage.field_2._8_4_ = local_270._8_4_;
    local_f10.errorMessage.field_2._12_4_ = local_270._12_4_;
  }
  else {
    local_f10.errorMessage._M_dataplus._M_p = (pointer)local_280;
  }
  local_f10.errorMessage._M_string_length = local_278;
  local_278 = 0;
  local_270._M_allocated_capacity._0_4_ = local_270._M_allocated_capacity._0_4_ & 0xffffff00;
  local_280 = &local_270;
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  local_ec0 = local_eb0;
  local_ed8 = 0x1400000000;
  local_ed0 = 1;
  local_ec8 = 0xffffffffffffffff;
  if (local_260 == local_250) {
    uStack_ea8 = uStack_248;
    uStack_ea4 = uStack_244;
  }
  else {
    local_ec0 = local_260;
  }
  local_eb8 = local_258;
  local_258 = 0;
  local_250[0] = local_250[0] & 0xffffff00;
  local_260 = local_250;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  local_e88 = local_e78;
  local_ea0 = 0xffffffff00000004;
  local_e98 = 0;
  local_e90 = 2;
  if (local_240 == local_230) {
    uStack_e70 = uStack_228;
    uStack_e6c = uStack_224;
  }
  else {
    local_e88 = local_240;
  }
  local_e80 = local_238;
  local_238 = 0;
  local_230[0] = local_230[0] & 0xffffff00;
  local_240 = local_230;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
  local_e50 = local_e40;
  local_e68 = 0xffffffff0000000c;
  local_e60 = 0;
  local_e58 = 0;
  if (local_220 == local_210) {
    uStack_e38 = uStack_208;
    uStack_e34 = uStack_204;
  }
  else {
    local_e50 = local_220;
  }
  local_e48 = local_218;
  local_218 = 0;
  local_210[0] = local_210[0] & 0xffffff00;
  local_220 = local_210;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"expected \"in\"","");
  local_e18 = local_e08;
  local_e30 = 0x1500000000;
  local_e28 = 1;
  local_e20 = 0xffffffffffffffff;
  if (local_200 == local_1f0) {
    uStack_e00 = uStack_1e8;
    uStack_dfc = uStack_1e4;
  }
  else {
    local_e18 = local_200;
  }
  local_e10 = local_1f8;
  local_1f8 = 0;
  local_1f0[0] = local_1f0[0] & 0xffffff00;
  local_200 = local_1f0;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"expected expression","");
  local_de0[0] = local_dd0;
  local_df8 = &DAT_ffffffff00000006;
  local_df0 = 1;
  local_de8 = 3;
  if (local_1e0 == local_1d0) {
    uStack_dc8 = uStack_1c8;
  }
  else {
    local_de0[0] = local_1e0;
  }
  local_de0[1] = (undefined1 *)local_1d8;
  local_1d8 = 0;
  local_1d0[0] = 0;
  __l_08._M_len = 6;
  __l_08._M_array = &local_f10;
  local_1e0 = local_1d0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_658,__l_08,&local_52);
  local_12d8 = 4;
  local_12d0 = 0;
  local_12c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_658.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_12c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_658.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_12c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_658.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_658.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_16d0[0] = 0xe;
  local_16c8 = 4;
  local_16c0 = 0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_16b8,&local_12c8);
  local_48 = local_16a0;
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  local_c38.errorMessage._M_dataplus._M_p = (pointer)&local_c38.errorMessage.field_2;
  local_c38.type = LabelWithColon;
  local_c38.token = Invalid;
  local_c38.required = false;
  local_c38.subNodeIndex = 0;
  if (local_1c0 == &local_1b0) {
    local_c38.errorMessage.field_2._8_4_ = local_1b0._8_4_;
    local_c38.errorMessage.field_2._12_4_ = local_1b0._12_4_;
  }
  else {
    local_c38.errorMessage._M_dataplus._M_p = (pointer)local_1c0;
  }
  local_c38.errorMessage._M_string_length = local_1b8;
  local_1b8 = 0;
  local_1b0._M_allocated_capacity._0_4_ = local_1b0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_1c0 = &local_1b0;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"");
  local_be8 = local_bd8;
  local_c00 = 0x1600000000;
  local_bf8 = 1;
  local_bf0 = 0xffffffffffffffff;
  if (local_1a0 == local_190) {
    uStack_bd0 = uStack_188;
    uStack_bcc = uStack_184;
  }
  else {
    local_be8 = local_1a0;
  }
  local_be0 = local_198;
  local_198 = 0;
  local_190[0] = local_190[0] & 0xffffff00;
  local_1a0 = local_190;
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"expected expression","");
  local_bb0[0] = local_ba0;
  local_bc8 = &DAT_ffffffff00000006;
  local_bc0 = 1;
  local_bb8 = 1;
  if (local_180 == local_170) {
    uStack_b98 = uStack_168;
  }
  else {
    local_bb0[0] = local_180;
  }
  local_bb0[1] = (undefined1 *)local_178;
  local_178 = 0;
  local_170[0] = 0;
  __l_09._M_len = 3;
  __l_09._M_array = &local_c38;
  local_180 = local_170;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_638,__l_09,&local_51);
  local_12b0 = 2;
  local_12a8 = 0;
  local_12a0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_638.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_12a0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_638.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_12a0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_638.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_638.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_16a0[0] = 0xf;
  local_1698 = 2;
  local_1690 = 0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1688,&local_12a0);
  local_48 = local_1670;
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"expected expression","");
  local_980._M_p = local_970;
  local_998 = &DAT_ffffffff00000006;
  local_990 = true;
  local_988 = 0;
  if (local_160 == local_150) {
    local_970[8] = (undefined1)uStack_148;
    local_970[9] = uStack_148._1_1_;
    local_970[10] = uStack_148._2_1_;
    local_970[0xb] = uStack_148._3_1_;
    local_970[0xc] = uStack_148._4_1_;
    local_970[0xd] = uStack_148._5_1_;
    local_970[0xe] = uStack_148._6_1_;
    local_970[0xf] = uStack_148._7_1_;
  }
  else {
    local_980._M_p = local_160;
  }
  local_978 = local_158;
  local_158 = 0;
  local_150[0] = '\0';
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&local_998;
  local_160 = local_150;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_618,__l_10,&local_50);
  local_1288 = 1;
  local_1280 = 1;
  local_1278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_618.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_618.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_618.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_618.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1670[0] = 0x10;
  local_1668 = 1;
  local_1660 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1658,&local_1278);
  local_48 = local_1640;
  local_140 = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"expected expression","");
  local_948._M_p = local_938;
  local_960 = &DAT_ffffffff00000006;
  local_958 = true;
  local_950 = 0;
  if (local_140 == local_130) {
    local_938[8] = (undefined1)uStack_128;
    local_938[9] = uStack_128._1_1_;
    local_938[10] = uStack_128._2_1_;
    local_938[0xb] = uStack_128._3_1_;
    local_938[0xc] = uStack_128._4_1_;
    local_938[0xd] = uStack_128._5_1_;
    local_938[0xe] = uStack_128._6_1_;
    local_938[0xf] = uStack_128._7_1_;
  }
  else {
    local_948._M_p = local_140;
  }
  local_940 = local_138;
  local_138 = 0;
  local_130[0] = '\0';
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&local_960;
  local_140 = local_130;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_5f8,__l_11,&local_4f);
  local_1260 = 1;
  local_1258 = 1;
  local_1250.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_5f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1250.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_5f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1250.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_5f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1640[0] = 0x11;
  local_1638 = 1;
  local_1630 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1628,&local_1250);
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1238 = 0;
  local_1230 = 1;
  local_1228.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1228.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1228.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1610 = 0x12;
  local_1608 = 0;
  local_1600 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_15f8,&local_1228);
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1210 = 0;
  local_1208 = 1;
  local_1200.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1200.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1200.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e0 = 0x13;
  local_15d8 = 0;
  local_15d0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_15c8,&local_1200);
  local_48 = local_15b0;
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  local_b90.errorMessage._M_dataplus._M_p = (pointer)&local_b90.errorMessage.field_2;
  local_b90.type = LabelWithColon;
  local_b90.token = Invalid;
  local_b90.required = false;
  local_b90.subNodeIndex = 0;
  if (local_120 == &local_110) {
    local_b90.errorMessage.field_2._8_4_ = local_110._8_4_;
    local_b90.errorMessage.field_2._12_4_ = local_110._12_4_;
  }
  else {
    local_b90.errorMessage._M_dataplus._M_p = (pointer)local_120;
  }
  local_b90.errorMessage._M_string_length = local_118;
  local_118 = 0;
  local_110._M_allocated_capacity._0_4_ = local_110._M_allocated_capacity._0_4_ & 0xffffff00;
  local_120 = &local_110;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"expected exception-class list","");
  local_b40[0] = local_b30;
  local_b58 = 0xffffffff0000000a;
  local_b50 = 1;
  local_b48 = 1;
  if (local_100 == local_f0) {
    uStack_b28 = uStack_e8;
  }
  else {
    local_b40[0] = local_100;
  }
  local_b40[1] = (undefined1 *)local_f8;
  local_f8 = 0;
  local_f0[0] = 0;
  __l_12._M_len = 2;
  __l_12._M_array = &local_b90;
  local_100 = local_f0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_5d8,__l_12,&local_4e);
  local_11e8 = 2;
  local_11e0 = 1;
  local_11d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_5d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_11d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_5d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_11d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_5d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15b0[0] = 0x14;
  local_15a8 = 2;
  local_15a0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1598,&local_11d8);
  local_7a8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_11c0 = 0;
  local_11b8 = 1;
  local_11b0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_11b0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11b0.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1580 = 0x15;
  local_1578 = 0;
  local_1570 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1568,&local_11b0);
  local_48 = local_1550;
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  local_928.errorMessage._M_dataplus._M_p = (pointer)&local_928.errorMessage.field_2;
  local_928.type = Label;
  local_928.token = Invalid;
  local_928.required = false;
  local_928.subNodeIndex = 0;
  if (local_e0 == &local_d0) {
    local_928.errorMessage.field_2._8_8_ = local_d0._8_8_;
  }
  else {
    local_928.errorMessage._M_dataplus._M_p = (pointer)local_e0;
  }
  local_928.errorMessage._M_string_length = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  __l_13._M_len = 1;
  __l_13._M_array = &local_928;
  local_e0 = &local_d0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_5b8,__l_13,&local_4d);
  local_1198 = 1;
  local_1190 = 1;
  local_1188.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_5b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1188.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_5b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1188.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_5b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1550[0] = 0x16;
  local_1548 = 1;
  local_1540 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1538,&local_1188);
  local_48 = local_1520;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  local_8f0.errorMessage._M_dataplus._M_p = (pointer)&local_8f0.errorMessage.field_2;
  local_8f0.type = Label;
  local_8f0.token = Invalid;
  local_8f0.required = false;
  local_8f0.subNodeIndex = 0;
  if (local_c0 == &local_b0) {
    local_8f0.errorMessage.field_2._8_8_ = local_b0._8_8_;
  }
  else {
    local_8f0.errorMessage._M_dataplus._M_p = (pointer)local_c0;
  }
  local_8f0.errorMessage._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  __l_14._M_len = 1;
  __l_14._M_array = &local_8f0;
  local_c0 = &local_b0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_598,__l_14,&local_4c);
  local_1170 = 1;
  local_1168 = 1;
  local_1160.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_598.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1160.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_598.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1160.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_598.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_598.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1520[0] = 0x17;
  local_1518 = 1;
  local_1510 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1508,&local_1160);
  local_48 = local_14f0;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  local_8b8.errorMessage._M_dataplus._M_p = (pointer)&local_8b8.errorMessage.field_2;
  local_8b8.type = TupleExpression;
  local_8b8.token = Invalid;
  local_8b8.required = false;
  local_8b8.subNodeIndex = 0;
  if (local_a0 == &local_90) {
    local_8b8.errorMessage.field_2._8_8_ = local_90._8_8_;
  }
  else {
    local_8b8.errorMessage._M_dataplus._M_p = (pointer)local_a0;
  }
  local_8b8.errorMessage._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  __l_15._M_len = 1;
  __l_15._M_array = &local_8b8;
  local_a0 = &local_90;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_578,__l_15,&local_4b);
  local_1148 = 1;
  local_1140 = 1;
  local_1138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_578.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_578.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_578.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_578.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14f0[0] = 0x18;
  local_14e8 = 1;
  local_14e0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_14d8,&local_1138);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  local_868._M_p = local_858;
  local_880 = &DAT_ffffffff00000006;
  local_878 = false;
  local_870 = 0;
  if (local_80 == local_70) {
    local_858[8] = (undefined1)uStack_68;
    local_858[9] = uStack_68._1_1_;
    local_858[10] = uStack_68._2_1_;
    local_858[0xb] = uStack_68._3_1_;
    local_858[0xc] = uStack_68._4_1_;
    local_858[0xd] = uStack_68._5_1_;
    local_858[0xe] = uStack_68._6_1_;
    local_858[0xf] = uStack_68._7_1_;
  }
  else {
    local_868._M_p = local_80;
  }
  local_860 = local_78;
  local_78 = 0;
  local_70[0] = '\0';
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&local_880;
  local_80 = local_70;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_558,__l_16,&local_4a);
  local_1120 = 1;
  local_1118 = 1;
  local_1110.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_558.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1110.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_558.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1110.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_558.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_558.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14c0 = 0x19;
  local_14b8 = 1;
  local_14b0 = 1;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_14a8,&local_1110);
  __l_17._M_len = 0x18;
  __l_17._M_array = &local_1910;
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
            *)local_790,__l_17,&local_49);
  lVar4 = 0x468;
  do {
    std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
    ~vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
             *)(&local_1910.first + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -0x18);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1110);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_558);
  if (local_868._M_p != local_858) {
    operator_delete(local_868._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1138);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8.errorMessage._M_dataplus._M_p != &local_8b8.errorMessage.field_2) {
    operator_delete(local_8b8.errorMessage._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1160);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.errorMessage._M_dataplus._M_p != &local_8f0.errorMessage.field_2) {
    operator_delete(local_8f0.errorMessage._M_dataplus._M_p);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1188);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.errorMessage._M_dataplus._M_p != &local_928.errorMessage.field_2) {
    operator_delete(local_928.errorMessage._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_11b0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_7a8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_11d8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_5d8);
  lVar4 = 0;
  do {
    if (local_b30 + lVar4 != *(undefined1 **)((long)local_b40 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_b40 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x70);
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1200);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_7c8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1228);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_7e8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1250);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_5f8);
  if (local_948._M_p != local_938) {
    operator_delete(local_948._M_p);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1278);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_618);
  if (local_980._M_p != local_970) {
    operator_delete(local_980._M_p);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_12a0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_638);
  lVar4 = 0;
  do {
    if (local_ba0 + lVar4 != *(undefined1 **)((long)local_bb0 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_bb0 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0xa8);
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_12c8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_658);
  lVar4 = 0;
  do {
    if (local_dd0 + lVar4 != *(undefined1 **)((long)local_de0 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_de0 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x150);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_12f0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_808);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1318);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_678);
  if (local_9b8._M_p != local_9a8) {
    operator_delete(local_9b8._M_p);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1340);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_698);
  if (local_9f0._M_p != local_9e0) {
    operator_delete(local_9f0._M_p);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_10e8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_828);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1368);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_6b8);
  lVar4 = 0;
  do {
    if (local_c48 + lVar4 != *(undefined1 **)((long)local_c58 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_c58 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0xa8);
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1390);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_6d8);
  if (local_a28._M_p != local_a18) {
    operator_delete(local_a28._M_p);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_13b8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_848);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_13e0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_6f8);
  if (local_a60._M_p != local_a50) {
    operator_delete(local_a60._M_p);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1408);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_718);
  lVar4 = 0;
  do {
    if (local_cf0 + lVar4 != *(undefined1 **)((long)local_d00 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_d00 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0xe0);
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1430);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.errorMessage._M_dataplus._M_p != &local_ab0.errorMessage.field_2) {
    operator_delete(local_ab0.errorMessage._M_dataplus._M_p);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1458);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_758);
  lVar4 = 0;
  do {
    if (local_f20 + lVar4 != *(undefined1 **)((long)local_f30 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_f30 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x1c0);
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1480);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
           *)&sourceForStAttrs.
              super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar4 = 0;
  do {
    if (local_ac0 + lVar4 != *(undefined1 **)((long)local_ad0 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_ad0 + lVar4));
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x70);
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_790 ==
      (undefined1  [8])
      sourceForStAttrs.
      super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __new_size = 1;
  }
  else {
    auVar3 = local_790;
    uVar5 = 0;
    do {
      uVar6 = (ulong)((pointer)auVar3)->first;
      if (((pointer)auVar3)->first < uVar5) {
        uVar6 = uVar5;
      }
      auVar3 = (undefined1  [8])((long)auVar3 + 0x30);
      uVar5 = uVar6;
    } while (auVar3 != (undefined1  [8])
                       sourceForStAttrs.
                       super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __new_size = uVar6 + 1;
  }
  std::vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_>::resize
            ((vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_> *)
             &stAttrs,__new_size);
  for (auVar3 = local_790;
      auVar3 != (undefined1  [8])
                sourceForStAttrs.
                super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar3 = (undefined1  [8])((long)auVar3 + 0x30)) {
    sVar2 = (((pointer)auVar3)->second).skipTokens;
    psVar1 = (size_t *)(stAttrs + (ulong)((pointer)auVar3)->first * 0x28);
    *psVar1 = (((pointer)auVar3)->second).subNodes;
    psVar1[1] = sVar2;
    std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
    operator=((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
               *)(psVar1 + 2),&(((pointer)auVar3)->second).pattern);
  }
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::~vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             *)local_790);
  return;
}

Assistant:

static void initializeStTables() {
	const std::vector<std::pair<NodeType, StatementAttributes>> sourceForStAttrs = {
			{NodeType::Import, {SubNode::Import_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Import_Alias},
					{StPt::Name, StringId::Invalid, true, SubNode::Import_Package, "expected package name"}
			}}},
			{NodeType::Def, {SubNode::Def_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Def_Static},
					{StPt::Name, StringId::Invalid, false, SubNode::Def_Name},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Variation},
					{StPt::ParameterList, StringId::Invalid, true, SubNode::Def_Parameter, "expected parameter list"},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Operator},
					{StPt::ParameterList, StringId::Invalid, false, SubNode::Def_OperatorParameter},
					{StPt::Token, StringId::Delete, false, SubNode::Def_Delete},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Def_Qualifiers}
			}}},
			{NodeType::DefOperator, {1, 2, {
					{StPt::OperatorParameter, StringId::Invalid, true, 0, "expected operator parameter set"}
			}}},
			{NodeType::Class, {SubNode::Class_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Class_Static},
					{StPt::Name, StringId::Invalid, true, SubNode::Class_Name, "expected class name"},
					{StPt::Token, StringId::Extends, false, SubNode::Class_Extends},
					{StPt::ClassList, StringId::Invalid, false, SubNode::Class_BaseClassList}
			}}},
			{NodeType::Expression, {1, 0, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Sync, {0, 1, {}}},
			{NodeType::Touch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Var, {SubNode::Var_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Var_Static},
					{StPt::VarDefinitions, StringId::Invalid, true, SubNode::Var_Definitions, "expected variable definitions"},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Var_Qualifiers}
			}}},
			{NodeType::IfGroup, {0, 0, {}}},
			{NodeType::If, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::ElseIf, {1, 2, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Else, {0, 1, {}}},
			{NodeType::For, {SubNode::For_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Label},
					{StPt::Token, StringId::For, true, SIZE_MAX  /* internal error */},
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Iterator},
					{StPt::ForLoopVariables, StringId::Invalid, false, SubNode::For_LoopVariable},
					{StPt::Token, StringId::In, true, SIZE_MAX, "expected \"in\""},
					{StPt::Expression, StringId::Invalid, true, SubNode::For_Iterable, "expected expression"}
			}}},
			{NodeType::While, {SubNode::While_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::While_Label},
					{StPt::Token, StringId::While, true, SIZE_MAX  /* internal error */},
					{StPt::Expression, StringId::Invalid, true, SubNode::While_Condition, "expected expression"}
			}}},
			{NodeType::Switch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Case, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Default, {0, 1, {}}},
			{NodeType::Do, {0, 1, {}}},
			{NodeType::Catch, {SubNode::Catch_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Catch_Label},
					{StPt::ClassList, StringId::Invalid, true, SubNode::Catch_ClassList, "expected exception-class list"}
			}}},
			{NodeType::Finally, {0, 1, {}}},
			{NodeType::Break, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Continue, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Return, {1, 1, {
					{StPt::TupleExpression, StringId::Invalid, false, 0}
			}}},
			{NodeType::Throw, {1, 1, {
					{StPt::Expression, StringId::Invalid, false, 0}
			}}}
	};

	size_t maxIndex = 0;
	for (auto& p : sourceForStAttrs)
		maxIndex = std::max(maxIndex, static_cast<size_t>(p.first));
	stAttrs.resize(maxIndex + 1);
	for (auto& p : sourceForStAttrs)
		stAttrs[static_cast<size_t>(p.first)] = p.second;
}